

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

void UA_Client_deleteMembers(UA_Client *client)

{
  UA_Client_NotificationsAckNumber *pUVar1;
  UA_Client_Subscription *pUVar2;
  UA_Client_Subscription *tmps;
  UA_Client_Subscription *sub;
  UA_Client_NotificationsAckNumber *tmp;
  UA_Client_NotificationsAckNumber *n;
  UA_Client *client_local;
  
  UA_Client_disconnect(client);
  UA_SecureChannel_deleteMembersCleanup(&client->channel);
  UA_Connection_deleteMembers(&client->connection);
  if ((client->endpointUrl).data != (UA_Byte *)0x0) {
    UA_String_deleteMembers(&client->endpointUrl);
  }
  UA_UserTokenPolicy_deleteMembers(&client->token);
  UA_NodeId_deleteMembers(&client->authenticationToken);
  if ((client->username).data != (UA_Byte *)0x0) {
    UA_String_deleteMembers(&client->username);
  }
  if ((client->password).data != (UA_Byte *)0x0) {
    UA_String_deleteMembers(&client->password);
  }
  tmp = (client->pendingNotificationsAcks).lh_first;
  while (tmp != (UA_Client_NotificationsAckNumber *)0x0) {
    pUVar1 = (tmp->listEntry).le_next;
    if ((tmp->listEntry).le_next != (UA_Client_NotificationsAckNumber *)0x0) {
      (((tmp->listEntry).le_next)->listEntry).le_prev = (tmp->listEntry).le_prev;
    }
    *(tmp->listEntry).le_prev = (tmp->listEntry).le_next;
    free(tmp);
    tmp = pUVar1;
  }
  tmps = (client->subscriptions).lh_first;
  while (tmps != (UA_Client_Subscription *)0x0) {
    pUVar2 = (tmps->listEntry).le_next;
    UA_Client_Subscriptions_forceDelete(client,tmps);
    tmps = pUVar2;
  }
  return;
}

Assistant:

static void UA_Client_deleteMembers(UA_Client* client) {
    UA_Client_disconnect(client);
    UA_SecureChannel_deleteMembersCleanup(&client->channel);
    UA_Connection_deleteMembers(&client->connection);
    if(client->endpointUrl.data)
        UA_String_deleteMembers(&client->endpointUrl);
    UA_UserTokenPolicy_deleteMembers(&client->token);
    UA_NodeId_deleteMembers(&client->authenticationToken);
    if(client->username.data)
        UA_String_deleteMembers(&client->username);
    if(client->password.data)
        UA_String_deleteMembers(&client->password);
#ifdef UA_ENABLE_SUBSCRIPTIONS
    UA_Client_NotificationsAckNumber *n, *tmp;
    LIST_FOREACH_SAFE(n, &client->pendingNotificationsAcks, listEntry, tmp) {
        LIST_REMOVE(n, listEntry);
        UA_free(n);
    }
    UA_Client_Subscription *sub, *tmps;
    LIST_FOREACH_SAFE(sub, &client->subscriptions, listEntry, tmps)
        UA_Client_Subscriptions_forceDelete(client, sub); /* force local removal */
#endif
}